

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

void __thiscall GEO::KdTree::NearestNeighbors::copy_from_user(NearestNeighbors *this)

{
  float64 fVar1;
  uint local_14;
  index_t i;
  NearestNeighbors *this_local;
  
  for (local_14 = 0; local_14 < this->nb_neighbors_max; local_14 = local_14 + 1) {
    this->neighbors[local_14] = this->user_neighbors[local_14];
    this->neighbors_sq_dist[local_14] = this->user_neighbors_sq_dist[local_14];
  }
  this->neighbors[this->nb_neighbors_max] = 0xffffffff;
  fVar1 = Numeric::max_float64();
  this->neighbors_sq_dist[this->nb_neighbors_max] = (double)fVar1;
  this->nb_neighbors = this->nb_neighbors_max;
  return;
}

Assistant:

void copy_from_user() {
		for(index_t i=0; i<nb_neighbors_max; ++i) {
		    neighbors[i] = user_neighbors[i];
		    neighbors_sq_dist[i] = user_neighbors_sq_dist[i];
		}
		neighbors[nb_neighbors_max] = index_t(-1);
		neighbors_sq_dist[nb_neighbors_max] = Numeric::max_float64();
		nb_neighbors = nb_neighbors_max;
	    }